

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O2

mount_point * __thiscall cppcms::mount_point::operator=(mount_point *this,mount_point *other)

{
  selection_type sVar1;
  
  if (this != other) {
    booster::regex::operator=(&this->host_,&other->host_);
    booster::regex::operator=(&this->script_name_,&other->script_name_);
    booster::regex::operator=(&this->path_info_,&other->path_info_);
    sVar1 = other->selection_;
    this->group_ = other->group_;
    this->selection_ = sVar1;
  }
  return this;
}

Assistant:

mount_point const &mount_point::operator=(mount_point const &other) 
{
	if(this!=&other) {
		host_ = other.host_;
		script_name_ = other.script_name_;
		path_info_ = other.path_info_;
		group_ = other.group_;
		selection_ = other.selection_;
	}
	return *this;
}